

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalSetThreadPriority
                    (CPalThread *pThread,HANDLE hTargetThread,int iNewPriority)

{
  FILE *__stream;
  CPalThread *pCVar1;
  PAL_ERROR PVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  char *pcVar7;
  uint uVar8;
  CPalThread *local_48;
  CPalThread *pTargetThread;
  IPalObject *pobjThread;
  sched_param schedParam;
  int policy;
  
  local_48 = (CPalThread *)0x0;
  pTargetThread = (CPalThread *)0x0;
  PVar2 = InternalGetThreadDataFromHandle
                    (pThread,hTargetThread,0,&local_48,(IPalObject **)&pTargetThread);
  pCVar1 = local_48;
  if (PVar2 == 0) {
    InternalEnterCriticalSection(pThread,&local_48->m_csLock);
    uVar5 = iNewPriority + 0xf;
    if ((0x1e < uVar5) || ((0x4003e001U >> (uVar5 & 0x1f) & 1) == 0)) {
      fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x42d);
      fprintf(_stderr,"Priority %d not supported\n",(ulong)(uint)iNewPriority);
      PVar2 = 0x57;
      goto LAB_00209591;
    }
    if ((pCVar1->synchronizationInfo).m_tsThreadState == TS_DONE) {
LAB_002095d2:
      pCVar1->m_iThreadPriority = iNewPriority;
      PVar2 = 0;
    }
    else {
      iVar3 = pthread_getschedparam
                        (pCVar1->m_pthreadSelf,(int *)((long)&pobjThread + 4),
                         (sched_param *)&pobjThread);
      if (iVar3 == 0) {
        if (pobjThread._4_4_ == 0) {
          PVar2 = 0;
          if (PAL_InitializeChakraCoreCalled == false) {
LAB_002097fc:
            abort();
          }
          goto LAB_00209639;
        }
        iVar3 = sched_get_priority_max(pobjThread._4_4_);
        iVar4 = sched_get_priority_min(pobjThread._4_4_);
        if (iVar4 == -1 || iVar3 == -1) {
          fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                  ,0x459);
          __stream = _stderr;
          puVar6 = (uint *)__errno_location();
          uVar5 = *puVar6;
          pcVar7 = strerror(uVar5);
          fprintf(__stream,"sched_get_priority_min/max failed; error is %d (%s)\n",(ulong)uVar5,
                  pcVar7);
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002097fc;
          uVar8 = (uint)((float)iVar4 + (float)(iVar3 - iVar4) * ((float)(int)uVar5 / 30.0));
          pobjThread._0_4_ = uVar8;
          uVar5 = pthread_setschedparam
                            (pCVar1->m_pthreadSelf,pobjThread._4_4_,(sched_param *)&pobjThread);
          if (uVar5 == 0) goto LAB_002095d2;
          fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                  ,0x496);
          fprintf(_stderr,"Unable to set thread priority to %d (error %d)\n",(ulong)uVar8,
                  (ulong)uVar5);
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                ,0x443);
        fprintf(_stderr,"Unable to get current thread scheduling information\n");
      }
      PVar2 = 0x54f;
    }
  }
  else {
LAB_00209591:
    if (pCVar1 == (CPalThread *)0x0) goto LAB_00209648;
  }
LAB_00209639:
  InternalLeaveCriticalSection(pThread,&pCVar1->m_csLock);
LAB_00209648:
  if (pTargetThread != (CPalThread *)0x0) {
    (*pTargetThread->_vptr_CPalThread[8])(pTargetThread,pThread);
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetThreadPriority(
    CPalThread *pThread,
    HANDLE hTargetThread,
    int iNewPriority
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pTargetThread = NULL;
    IPalObject *pobjThread = NULL;

    int st;
    int policy;
    struct sched_param schedParam;
    int max_priority;
    int min_priority;
    float posix_priority;


    palError = InternalGetThreadDataFromHandle(
        pThread,
        hTargetThread,
        0, // THREAD_SET_INFORMATION
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetThreadPriorityExit;
    }

    pTargetThread->Lock(pThread);

    /* validate the requested priority */
    switch (iNewPriority)
    {
    case THREAD_PRIORITY_TIME_CRITICAL: /* fall through */
    case THREAD_PRIORITY_IDLE:
        break;

    case THREAD_PRIORITY_HIGHEST:       /* fall through */
    case THREAD_PRIORITY_ABOVE_NORMAL:  /* fall through */
    case THREAD_PRIORITY_NORMAL:        /* fall through */
    case THREAD_PRIORITY_BELOW_NORMAL:  /* fall through */
    case THREAD_PRIORITY_LOWEST:
#if PAL_IGNORE_NORMAL_THREAD_PRIORITY
        /* We aren't going to set the thread priority. Just record what it is,
           and exit */
        pTargetThread->m_iThreadPriority = iNewPriority;
        goto InternalSetThreadPriorityExit;
#endif
        break;

    default:
        ASSERT("Priority %d not supported\n", iNewPriority);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalSetThreadPriorityExit;
    }

    /* check if the thread is still running */
    if (TS_DONE == pTargetThread->synchronizationInfo.GetThreadState())
    {
        /* the thread has exited, set the priority in the thread structure
           and exit */
        pTargetThread->m_iThreadPriority = iNewPriority;
        goto InternalSetThreadPriorityExit;
    }

    /* get the previous thread schedule parameters.  We need to know the
       scheduling policy to determine the priority range */
    if (pthread_getschedparam(
            pTargetThread->GetPThreadSelf(),
            &policy,
            &schedParam
            ) != 0)
    {
        ASSERT("Unable to get current thread scheduling information\n");
        palError = ERROR_INTERNAL_ERROR;
        goto InternalSetThreadPriorityExit;
    }

#if !HAVE_SCHED_OTHER_ASSIGNABLE
    /* Defining thread priority for SCHED_OTHER is implementation defined.
       Some platforms like NetBSD cannot reassign it as they are dynamic.
    */
    if (policy == SCHED_OTHER)
    {
        TRACE("Pthread priority levels for SCHED_OTHER cannot be reassigned on this platform\n");
        goto InternalSetThreadPriorityExit;
    }
#endif

#if HAVE_SCHED_GET_PRIORITY
    max_priority = sched_get_priority_max(policy);
    min_priority = sched_get_priority_min(policy);
    if( -1 == max_priority || -1 == min_priority)
    {
        ASSERT("sched_get_priority_min/max failed; error is %d (%s)\n",
               errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalSetThreadPriorityExit;
    }
#else
    max_priority = PAL_THREAD_PRIORITY_MAX;
    min_priority = PAL_THREAD_PRIORITY_MIN;
#endif

    TRACE("Pthread priorities for policy %d must be in the range %d to %d\n",
          policy, min_priority, max_priority);

    /* explanation for fancy maths below :
       POSIX doesn't specify the range of thread priorities that can be used
       with pthread_setschedparam. Instead, one must use sched_get_priority_min
       and sched_get_priority_max to obtain the lower and upper bounds of this
       range. Since the PAL also uses a range of values (from Idle [-15] to
       Time Critical [+15]), we have to do a mapping from a known range to an
       unknown (at compilation) range.
       We do this by :
       -subtracting the minimal PAL priority from the desired priority. this
        gives a value between 0 and the PAL priority range
       -dividing this value by the PAL priority range. this allows us to
        express the desired priority as a floating-point value between 0 and 1
       -multiplying this value by the PTHREAD priority range. This gives a
        value between 0 and the PTHREAD priority range
       -adding the minimal PTHREAD priority range. This will give us a value
        between the minimal and maximla pthread priority, which should be
        equivalent to the original PAL value.

        example : suppose a pthread range 100 to 200, and a desired priority
                  of 0 (halfway between PAL minimum and maximum)
            0 - (IDLE [-15]) = 15
            15 / (TIMECRITICAL[15] - IDLE[-15]) = 0.5
            0.5 * (pthreadmax[200]-pthreadmin[100]) = 50
            50 + pthreadmin[100] = 150 -> halfway between pthread min and max
    */
    posix_priority =  (iNewPriority - THREAD_PRIORITY_IDLE);
    posix_priority /= (THREAD_PRIORITY_TIME_CRITICAL - THREAD_PRIORITY_IDLE);
    posix_priority *= (max_priority-min_priority);
    posix_priority += min_priority;

    schedParam.sched_priority = (int)posix_priority;

    TRACE("PAL priority %d is mapped to pthread priority %d\n",
          iNewPriority, schedParam.sched_priority);

    /* Finally, set the new priority into place */
    st = pthread_setschedparam(pTargetThread->GetPThreadSelf(), policy, &schedParam);
    if (st != 0)
    {
#if SET_SCHEDPARAM_NEEDS_PRIVS
        if (EPERM == st)
        {
            // UNIXTODO: Should log a warning to the event log
            TRACE("Caller does not have OS privileges to call pthread_setschedparam\n");
            pTargetThread->m_iThreadPriority = iNewPriority;
            goto InternalSetThreadPriorityExit;
        }
#endif

        ASSERT("Unable to set thread priority to %d (error %d)\n", (int)posix_priority, st);
        palError = ERROR_INTERNAL_ERROR;
        goto InternalSetThreadPriorityExit;
    }

    pTargetThread->m_iThreadPriority = iNewPriority;

InternalSetThreadPriorityExit:

    if (NULL != pTargetThread)
    {
        pTargetThread->Unlock(pThread);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    return palError;
}